

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void __thiscall Board::deplace(Board *this,Block *block)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *shape;
  int tmpY;
  int tmpX;
  int i;
  Block *block_local;
  Board *this_local;
  
  iVar1 = block->t;
  iVar2 = block->o;
  for (i = 0; i < 4; i = i + 1) {
    iVar3 = block->x + blockShape[iVar1][iVar2][i << 1];
    iVar4 = block->y + blockShape[iVar1][iVar2][i * 2 + 1];
    this->rows[iVar3] = 1 << ((byte)iVar4 & 0x1f) ^ this->rows[iVar3];
    this->cols[iVar4] = 1 << ((byte)iVar3 & 0x1f) ^ this->cols[iVar4];
  }
  return;
}

Assistant:

void Board::deplace(const Block &block){
    int i, tmpX, tmpY;
    auto shape = blockShape[block.t][block.o];
    for (i = 0; i < 4; ++i) {
        tmpX = block.x + shape[2 * i];
        tmpY = block.y + shape[2 * i + 1];
        rows[tmpX] ^= 1 << tmpY;
        cols[tmpY] ^= 1 << tmpX;
    }
}